

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

void __thiscall BattleWithLandlord::PrintCards(BattleWithLandlord *this)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"cards0: ");
  Translate_abi_cxx11_(&sStack_38,this,this->_cards);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"cards1: ");
  Translate_abi_cxx11_(&sStack_38,this,this->_cards + 1);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void BattleWithLandlord::PrintCards() {
    cout << "cards0: " << Translate(_cards[0]) << endl;
    cout << "cards1: " << Translate(_cards[1]) << endl;
}